

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall
GraphPropagator::fullExpl(GraphPropagator *this,vector<Lit,_std::allocator<Lit>_> *ps)

{
  uint uVar1;
  BoolView *pBVar2;
  iterator iVar3;
  int iVar4;
  undefined8 in_RAX;
  long lVar5;
  long lVar6;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if (0 < (int)(this->vs).sz) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pBVar2 = (this->vs).data;
      if (sat.assigns.data
          [*(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar5)] != '\0') {
        uVar1 = *(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar5);
        iVar4 = (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2;
        local_38 = CONCAT44(iVar4,local_38._0_4_);
        iVar3._M_current =
             (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar3._M_current ==
            (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (ps,iVar3,(Lit *)((long)&local_38 + 4));
        }
        else {
          (iVar3._M_current)->x = iVar4;
          (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar3._M_current + 1;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    lVar5 = 8;
    lVar6 = 0;
    do {
      pBVar2 = (this->es).data;
      if (sat.assigns.data
          [*(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar5)] != '\0') {
        uVar1 = *(uint *)((long)&(pBVar2->super_Var).super_Branching._vptr_Branching + lVar5);
        iVar4 = (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2;
        local_38 = CONCAT44(local_38._4_4_,iVar4);
        iVar3._M_current =
             (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar3._M_current ==
            (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>(ps,iVar3,(Lit *)&local_38);
        }
        else {
          (iVar3._M_current)->x = iVar4;
          (ps->super__Vector_base<Lit,_std::allocator<Lit>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar3._M_current + 1;
        }
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar6 < (int)(this->es).sz);
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(std::vector<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push_back(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push_back(getEdgeVar(i).getValLit());
		}
	}
}